

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int expand_logbuf_or_invalidate(char *prefix,size_t prefix_len,size_t capacity)

{
  int iVar1;
  long *in_FS_OFFSET;
  size_t capacity_local;
  size_t prefix_len_local;
  char *prefix_local;
  
  if (*(long *)(*in_FS_OFFSET + -200) == 0) {
    prefix_local._4_4_ = 0;
  }
  else {
    iVar1 = ptls_buffer_reserve((ptls_buffer_t *)(*in_FS_OFFSET + -200),prefix_len + capacity);
    if (iVar1 == 0) {
      memcpy((void *)(*(long *)(*in_FS_OFFSET + -200) + *(long *)(*in_FS_OFFSET + -0xb8)),prefix,
             prefix_len);
      *(size_t *)(*in_FS_OFFSET + -0xb8) = prefix_len + *(long *)(*in_FS_OFFSET + -0xb8);
      prefix_local._4_4_ = 1;
    }
    else {
      ptls_buffer_dispose((ptls_buffer_t *)(*in_FS_OFFSET + -200));
      if (*(long *)(*in_FS_OFFSET + -200) != 0) {
        __assert_fail("logbuf.buf.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x1b30,"int expand_logbuf_or_invalidate(const char *, size_t, size_t)");
      }
      prefix_local._4_4_ = 0;
    }
  }
  return prefix_local._4_4_;
}

Assistant:

static int expand_logbuf_or_invalidate(const char *prefix, size_t prefix_len, size_t capacity)
{
    if (logbuf.buf.base == NULL)
        return 0;

    if (ptls_buffer_reserve(&logbuf.buf, prefix_len + capacity) != 0) {
        ptls_buffer_dispose(&logbuf.buf);
        assert(logbuf.buf.base == NULL);
        return 0;
    }

    memcpy(logbuf.buf.base + logbuf.buf.off, prefix, prefix_len);
    logbuf.buf.off += prefix_len;

    return 1;
}